

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O1

HierarchicalInstanceSyntax * __thiscall
slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::operator[]
          (SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *this,size_t index)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar1;
  HierarchicalInstanceSyntax *pHVar2;
  
  if (index * 2 < (this->elements).size_) {
    ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                         ((this->elements).data_ + index * 2));
    pHVar2 = SyntaxNode::as<slang::syntax::HierarchicalInstanceSyntax>(*ppSVar1);
    return pHVar2;
  }
  std::terminate();
}

Assistant:

T* operator[](size_t index) {
        index <<= 1;
        return &elements[index].node()->template as<T>();
    }